

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::visitSelection
          (TGlslangToSpvTraverser *this,TVisit param_1,TIntermSelection *node)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TType *type;
  undefined4 extraout_var_01;
  TQualifier *this_00;
  undefined1 local_a0 [8];
  SpecConstantOpModeGuard spec_constant_op_mode_setter;
  anon_class_32_4_194a7839 executeOneSide;
  anon_class_40_5_76c142ff executeBothSides;
  Id condition;
  Id result;
  anon_class_16_2_44aef978 bothSidesPolicy;
  anon_class_16_2_3f94c575 isOpSelectable;
  TIntermSelection *node_local;
  TVisit param_1_local;
  TGlslangToSpvTraverser *this_local;
  
  bothSidesPolicy.isOpSelectable = (anon_class_16_2_3f94c575 *)&isOpSelectable.this;
  _condition = &isOpSelectable.this;
  bothSidesPolicy.node = (TIntermSelection **)&bothSidesPolicy.isOpSelectable;
  executeBothSides.result._4_4_ = 0;
  isOpSelectable.node = (TIntermSelection **)this;
  isOpSelectable.this = (TGlslangToSpvTraverser *)node;
  iVar2 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
            ((long *)CONCAT44(extraout_var,iVar2),this);
  iVar2 = (*((isOpSelectable.this)->super_TIntermTraverser)._vptr_TIntermTraverser[0x30])();
  type = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0xf0))();
  executeBothSides.result._0_4_ = accessChainLoad(this,type);
  executeBothSides.this = (TGlslangToSpvTraverser *)&isOpSelectable.this;
  executeBothSides.node = (TIntermSelection **)&bothSidesPolicy.isOpSelectable;
  executeBothSides.isOpSelectable = (anon_class_16_2_3f94c575 *)&executeBothSides.result;
  executeBothSides.condition = (Id *)((long)&executeBothSides.result + 4);
  spec_constant_op_mode_setter._8_8_ = &isOpSelectable.this;
  executeOneSide.node = (TIntermSelection **)((long)&executeBothSides.result + 4);
  executeOneSide.this = (TGlslangToSpvTraverser *)&executeBothSides.result;
  executeOneSide.result = (Id *)this;
  executeOneSide.condition = (Id *)this;
  bVar1 = visitSelection::anon_class_16_2_44aef978::operator()
                    ((anon_class_16_2_44aef978 *)&condition);
  if (bVar1) {
    anon_unknown_0::SpecConstantOpModeGuard::SpecConstantOpModeGuard
              ((SpecConstantOpModeGuard *)local_a0,&this->builder);
    iVar2 = (*((isOpSelectable.this)->super_TIntermTraverser)._vptr_TIntermTraverser[0x1e])();
    this_00 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x58))();
    bVar1 = glslang::TQualifier::isSpecConstant(this_00);
    if (bVar1) {
      anon_unknown_0::SpecConstantOpModeGuard::turnOnSpecConstantOpMode
                ((SpecConstantOpModeGuard *)local_a0);
    }
    visitSelection::anon_class_40_5_76c142ff::operator()
              ((anon_class_40_5_76c142ff *)&executeOneSide.condition);
    anon_unknown_0::SpecConstantOpModeGuard::~SpecConstantOpModeGuard
              ((SpecConstantOpModeGuard *)local_a0);
  }
  else {
    visitSelection::anon_class_32_4_194a7839::operator()
              ((anon_class_32_4_194a7839 *)&spec_constant_op_mode_setter.previous_flag_);
  }
  return false;
}

Assistant:

bool TGlslangToSpvTraverser::visitSelection(glslang::TVisit /* visit */, glslang::TIntermSelection* node)
{
    // see if OpSelect can handle it
    const auto isOpSelectable = [&]() {
        if (node->getBasicType() == glslang::EbtVoid)
            return false;
        // OpSelect can do all other types starting with SPV 1.4
        if (glslangIntermediate->getSpv().spv < glslang::EShTargetSpv_1_4) {
            // pre-1.4, only scalars and vectors can be handled
            if ((!node->getType().isScalar() && !node->getType().isVector()))
                return false;
        }
        return true;
    };

    // See if it simple and safe, or required, to execute both sides.
    // Crucially, side effects must be either semantically required or avoided,
    // and there are performance trade-offs.
    // Return true if required or a good idea (and safe) to execute both sides,
    // false otherwise.
    const auto bothSidesPolicy = [&]() -> bool {
        // do we have both sides?
        if (node->getTrueBlock()  == nullptr ||
            node->getFalseBlock() == nullptr)
            return false;

        // required? (unless we write additional code to look for side effects
        // and make performance trade-offs if none are present)
        if (!node->getShortCircuit())
            return true;

        // if not required to execute both, decide based on performance/practicality...

        if (!isOpSelectable())
            return false;

        assert(node->getType() == node->getTrueBlock() ->getAsTyped()->getType() &&
               node->getType() == node->getFalseBlock()->getAsTyped()->getType());

        // return true if a single operand to ? : is okay for OpSelect
        const auto operandOkay = [](glslang::TIntermTyped* node) {
            return node->getAsSymbolNode() || node->getType().getQualifier().isConstant();
        };

        return operandOkay(node->getTrueBlock() ->getAsTyped()) &&
               operandOkay(node->getFalseBlock()->getAsTyped());
    };

    spv::Id result = spv::NoResult; // upcoming result selecting between trueValue and falseValue
    // emit the condition before doing anything with selection
    node->getCondition()->traverse(this);
    spv::Id condition = accessChainLoad(node->getCondition()->getType());

    // Find a way of executing both sides and selecting the right result.
    const auto executeBothSides = [&]() -> void {
        // execute both sides
        spv::Id resultType = convertGlslangToSpvType(node->getType());
        node->getTrueBlock()->traverse(this);
        spv::Id trueValue = accessChainLoad(node->getTrueBlock()->getAsTyped()->getType());
        node->getFalseBlock()->traverse(this);
        spv::Id falseValue = accessChainLoad(node->getFalseBlock()->getAsTyped()->getType());

        builder.setDebugSourceLocation(node->getLoc().line, node->getLoc().getFilename());

        // done if void
        if (node->getBasicType() == glslang::EbtVoid)
            return;

        // emit code to select between trueValue and falseValue
        // see if OpSelect can handle the result type, and that the SPIR-V types
        // of the inputs match the result type.
        if (isOpSelectable()) {
            // Emit OpSelect for this selection.

            // smear condition to vector, if necessary (AST is always scalar)
            // Before 1.4, smear like for mix(), starting with 1.4, keep it scalar
            if (glslangIntermediate->getSpv().spv < glslang::EShTargetSpv_1_4 && builder.isVector(trueValue)) {
                condition = builder.smearScalar(spv::NoPrecision, condition,
                                                builder.makeVectorType(builder.makeBoolType(),
                                                                       builder.getNumComponents(trueValue)));
            }

            // If the types do not match, it is because of mismatched decorations on aggregates.
            // Since isOpSelectable only lets us get here for SPIR-V >= 1.4, we can use OpCopyObject
            // to get matching types.
            if (builder.getTypeId(trueValue) != resultType) {
                trueValue = builder.createUnaryOp(spv::OpCopyLogical, resultType, trueValue);
            }
            if (builder.getTypeId(falseValue) != resultType) {
                falseValue = builder.createUnaryOp(spv::OpCopyLogical, resultType, falseValue);
            }

            // OpSelect
            result = builder.createTriOp(spv::OpSelect, resultType, condition, trueValue, falseValue);

            builder.clearAccessChain();
            builder.setAccessChainRValue(result);
        } else {
            // We need control flow to select the result.
            // TODO: Once SPIR-V OpSelect allows arbitrary types, eliminate this path.
            result = builder.createVariable(TranslatePrecisionDecoration(node->getType()),
                spv::StorageClassFunction, resultType);

            // Selection control:
            const spv::SelectionControlMask control = TranslateSelectionControl(*node);

            // make an "if" based on the value created by the condition
            spv::Builder::If ifBuilder(condition, control, builder);

            // emit the "then" statement
            builder.clearAccessChain();
            builder.setAccessChainLValue(result);
            multiTypeStore(node->getType(), trueValue);

            ifBuilder.makeBeginElse();
            // emit the "else" statement
            builder.clearAccessChain();
            builder.setAccessChainLValue(result);
            multiTypeStore(node->getType(), falseValue);

            // finish off the control flow
            ifBuilder.makeEndIf();

            builder.clearAccessChain();
            builder.setAccessChainLValue(result);
        }
    };

    // Execute the one side needed, as per the condition
    const auto executeOneSide = [&]() {
        // Always emit control flow.
        if (node->getBasicType() != glslang::EbtVoid) {
            result = builder.createVariable(TranslatePrecisionDecoration(node->getType()), spv::StorageClassFunction,
                convertGlslangToSpvType(node->getType()));
        }

        // Selection control:
        const spv::SelectionControlMask control = TranslateSelectionControl(*node);

        // make an "if" based on the value created by the condition
        spv::Builder::If ifBuilder(condition, control, builder);

        // emit the "then" statement
        if (node->getTrueBlock() != nullptr) {
            node->getTrueBlock()->traverse(this);
            if (result != spv::NoResult) {
                spv::Id load = accessChainLoad(node->getTrueBlock()->getAsTyped()->getType());

                builder.clearAccessChain();
                builder.setAccessChainLValue(result);
                multiTypeStore(node->getType(), load);
            }
        }

        if (node->getFalseBlock() != nullptr) {
            ifBuilder.makeBeginElse();
            // emit the "else" statement
            node->getFalseBlock()->traverse(this);
            if (result != spv::NoResult) {
                spv::Id load = accessChainLoad(node->getFalseBlock()->getAsTyped()->getType());

                builder.clearAccessChain();
                builder.setAccessChainLValue(result);
                multiTypeStore(node->getType(), load);
            }
        }

        // finish off the control flow
        ifBuilder.makeEndIf();

        if (result != spv::NoResult) {
            builder.clearAccessChain();
            builder.setAccessChainLValue(result);
        }
    };

    // Try for OpSelect (or a requirement to execute both sides)
    if (bothSidesPolicy()) {
        SpecConstantOpModeGuard spec_constant_op_mode_setter(&builder);
        if (node->getType().getQualifier().isSpecConstant())
            spec_constant_op_mode_setter.turnOnSpecConstantOpMode();
        executeBothSides();
    } else
        executeOneSide();

    return false;
}